

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

double evaluate_MFE(vector<int,_std::allocator<int>_> *rna,string *bp)

{
  int iVar1;
  ulong uVar2;
  vector<int,_std::allocator<int>_> *in_RDI;
  ZukerAlgorithm *this;
  double mfe;
  ZukerAlgorithm Zu;
  int l;
  string *in_stack_fffffffffffffeb8;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff38;
  ZukerAlgorithm *in_stack_ffffffffffffff40;
  
  std::vector<int,_std::allocator<int>_>::size(in_RDI);
  ZukerAlgorithm::ZukerAlgorithm
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
  iVar1 = ZukerAlgorithm::calculate_W
                    ((ZukerAlgorithm *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                    );
  this = (ZukerAlgorithm *)(double)iVar1;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    ZukerAlgorithm::traceback_2((ZukerAlgorithm *)Zu._16_8_);
    ZukerAlgorithm::get_bp(this,in_stack_fffffffffffffeb8);
  }
  ZukerAlgorithm::~ZukerAlgorithm(this);
  return (double)this;
}

Assistant:

double evaluate_MFE(vector<int> & rna, string & bp) {
    int l = int(rna.size());
    ZukerAlgorithm Zu = ZukerAlgorithm(rna,l);
    double mfe = Zu.calculate_W();
    if (!bp.empty()) {
        Zu.traceback_2();
        Zu.get_bp(bp);
    }
    return mfe;

}